

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O0

void ExtractBitLengths(Node *chain,Node *leaves,uint *bitlengths)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int val;
  Node *node;
  uint value;
  uint ptr;
  uint end;
  int counts [16];
  int local_74;
  long local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58 [15];
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_58,0,0x40);
  local_5c = 0x10;
  local_60 = 0xf;
  local_64 = 1;
  for (local_70 = local_8; local_70 != 0; local_70 = *(long *)(local_70 + 8)) {
    local_5c = local_5c - 1;
    local_58[local_5c] = *(int *)(local_70 + 0x10);
  }
  local_74 = local_1c;
  for (; local_5c <= local_60; local_60 = local_60 - 1) {
    for (; local_58[local_60 - 1] < local_74; local_74 = local_74 + -1) {
      *(int *)(local_18 + (long)*(int *)(local_10 + (long)(local_74 + -1) * 0x18 + 0x10) * 4) =
           local_64;
    }
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

static void ExtractBitLengths(Node* chain, Node* leaves, unsigned* bitlengths) {
  int counts[16] = {0};
  unsigned end = 16;
  unsigned ptr = 15;
  unsigned value = 1;
  Node* node;
  int val;

  for (node = chain; node; node = node->tail) {
    counts[--end] = node->count;
  }

  val = counts[15];
  while (ptr >= end) {
    for (; val > counts[ptr - 1]; val--) {
      bitlengths[leaves[val - 1].count] = value;
    }
    ptr--;
    value++;
  }
}